

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_bool nk_combo_begin_symbol_text
                  (nk_context *ctx,char *selected,int len,nk_symbol_type symbol,nk_vec2 size)

{
  nk_rect r;
  nk_rect r_00;
  nk_rect rect;
  nk_rect rect_00;
  nk_rect header_00;
  nk_rect b;
  nk_rect content_00;
  nk_widget_layout_states nVar1;
  nk_bool nVar2;
  undefined4 in_ECX;
  undefined4 in_EDX;
  undefined8 in_RSI;
  nk_input *in_RDI;
  float fVar3;
  float a;
  float fVar4;
  float len_00;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  nk_vec2 nVar10;
  nk_symbol_type sym;
  nk_rect image;
  nk_rect label;
  nk_rect button;
  nk_rect content;
  nk_text text;
  nk_color symbol_color;
  nk_style_item *background;
  nk_widget_layout_states s;
  int is_clicked;
  nk_rect header;
  nk_input *in;
  nk_style *style;
  nk_window *win;
  undefined8 in_stack_ffffffffffffff28;
  nk_input *i;
  nk_flags *in_stack_ffffffffffffff38;
  nk_symbol_type type;
  float in_stack_ffffffffffffff40;
  float in_stack_ffffffffffffff44;
  undefined4 in_stack_ffffffffffffff48;
  nk_flags in_stack_ffffffffffffff4c;
  float in_stack_ffffffffffffff50;
  nk_color in_stack_ffffffffffffff54;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  undefined4 in_stack_ffffffffffffff60;
  float in_stack_ffffffffffffff64;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  float fVar11;
  nk_color in_stack_ffffffffffffff84;
  float fVar12;
  float fVar13;
  nk_color nVar14;
  float fVar15;
  nk_key *local_60;
  float local_50;
  float fStack_4c;
  float in_stack_ffffffffffffffb8;
  float in_stack_ffffffffffffffbc;
  nk_input *out;
  nk_key nVar16;
  nk_bool local_4;
  
  if (((in_RDI == (nk_input *)0x0) || (in_RDI[0x2e].keyboard.keys[5] == (nk_key)0x0)) ||
     (*(long *)((long)in_RDI[0x2e].keyboard.keys[5] + 0xa8) == 0)) {
    local_4 = 0;
  }
  else {
    nVar16 = in_RDI[0x2e].keyboard.keys[5];
    out = in_RDI + 1;
    nVar1 = nk_widget((nk_rect *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                      (nk_context *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
    if (nVar1 == NK_WIDGET_INVALID) {
      local_4 = 0;
    }
    else {
      if (((*(uint *)(*(long *)((long)nVar16 + 0xa8) + 4) & 0x1000) != 0) ||
         (i = in_RDI, nVar1 == NK_WIDGET_ROM)) {
        i = (nk_input *)0x0;
      }
      r.y = (float)in_stack_ffffffffffffff48;
      r.x = in_stack_ffffffffffffff44;
      r.w = (float)in_stack_ffffffffffffff4c;
      r.h = in_stack_ffffffffffffff50;
      nVar2 = nk_button_behavior(in_stack_ffffffffffffff38,r,i,
                                 (nk_button_behavior)((ulong)in_stack_ffffffffffffff28 >> 0x20));
      type = (nk_symbol_type)((ulong)in_stack_ffffffffffffff38 >> 0x20);
      if ((in_RDI[0x16].keyboard.keys[0x10].down & 0x20U) == 0) {
        if ((in_RDI[0x16].keyboard.keys[0x10].down & 0x10U) == 0) {
          local_60 = (nk_key *)&out[0x11].mouse.scroll_delta.y;
          fVar15 = (float)out[0x12].keyboard.keys[0xb].clicked;
        }
        else {
          local_60 = out[0x12].keyboard.keys + 3;
          fVar15 = (float)out[0x12].keyboard.keys[0xc].down;
        }
      }
      else {
        local_60 = out[0x12].keyboard.keys + 7;
        fVar15 = (float)out[0x12].keyboard.keys[0xc].clicked;
      }
      if (local_60->down == 1) {
        in_stack_ffffffffffffff84 = nk_rgba(0,0,0,0);
        r_00.y = (float)in_stack_ffffffffffffff5c;
        r_00.x = (float)in_stack_ffffffffffffff58;
        r_00.w = (float)in_stack_ffffffffffffff60;
        r_00.h = in_stack_ffffffffffffff64;
        nVar14 = in_stack_ffffffffffffff84;
        nk_draw_image((nk_command_buffer *)
                      CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),r_00,
                      (nk_image *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                      in_stack_ffffffffffffff54);
      }
      else {
        nVar14 = *(nk_color *)(local_60 + 1);
        rect.y = (float)in_stack_ffffffffffffff5c;
        rect.x = (float)in_stack_ffffffffffffff58;
        rect.w = (float)in_stack_ffffffffffffff60;
        rect.h = in_stack_ffffffffffffff64;
        nk_fill_rect((nk_command_buffer *)
                     CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),rect,
                     in_stack_ffffffffffffff44,in_stack_ffffffffffffff54);
        rect_00.y = (float)in_stack_ffffffffffffff5c;
        rect_00.x = (float)in_stack_ffffffffffffff58;
        rect_00.w = (float)in_stack_ffffffffffffff60;
        rect_00.h = in_stack_ffffffffffffff64;
        nk_stroke_rect((nk_command_buffer *)
                       CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),rect_00,
                       in_stack_ffffffffffffff44,in_stack_ffffffffffffff40,in_stack_ffffffffffffff54
                      );
      }
      if ((in_RDI[0x16].keyboard.keys[0x10].down & 0x10U) == 0) {
        if (nVar2 == 0) {
          fVar9 = (float)out[0x12].mouse.buttons[2].clicked;
        }
        else {
          fVar9 = out[0x12].mouse.buttons[2].clicked_pos.y;
        }
      }
      else {
        fVar9 = out[0x12].mouse.buttons[2].clicked_pos.x;
      }
      fVar11 = out[0x12].mouse.pos.y;
      fVar3 = in_stack_ffffffffffffffbc - (fVar11 + fVar11);
      a = ((local_50 + in_stack_ffffffffffffffb8) - in_stack_ffffffffffffffbc) -
          out[0x12].mouse.pos.x;
      fVar4 = fStack_4c + out[0x12].mouse.pos.y;
      len_00 = a + *(float *)(out[0x12].keyboard.text + 8);
      fVar5 = fVar4 + *(float *)(out[0x12].keyboard.text + 0xc);
      fVar11 = *(float *)(out[0x12].keyboard.text + 8);
      fVar6 = fVar3 - (fVar11 + fVar11);
      fVar11 = *(float *)(out[0x12].keyboard.text + 0xc);
      fVar7 = fVar3 - (fVar11 + fVar11);
      fVar11 = fVar3;
      nk_draw_button_symbol
                ((nk_command_buffer *)CONCAT44(a,in_stack_ffffffffffffff60),
                 (nk_rect *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                 (nk_rect *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                 in_stack_ffffffffffffff4c,
                 (nk_style_button *)CONCAT44(in_stack_ffffffffffffff44,fVar9),type,
                 (nk_user_font *)CONCAT44(len_00,fVar3));
      fVar8 = local_50 + out[0x12].mouse.buttons[3].clicked_pos.x;
      fVar9 = out[0x12].mouse.buttons[3].clicked_pos.y;
      fVar9 = in_stack_ffffffffffffffbc - (fVar9 + fVar9);
      content_00.y = (float)in_EDX;
      content_00.x = (float)in_ECX;
      content_00.w = (float)(int)in_RSI;
      content_00.h = (float)(int)((ulong)in_RSI >> 0x20);
      nk_draw_symbol((nk_command_buffer *)out,(nk_symbol_type)((ulong)i >> 0x20),content_00,
                     (nk_color)nVar16.clicked,(nk_color)nVar16.down,SUB84(i,0),
                     (nk_user_font *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      nVar10 = nk_vec2(0.0,0.0);
      fVar12 = nVar10.x;
      fVar13 = nVar10.y;
      b.w = (float)nVar14;
      b.x = nVar10.x;
      b.y = nVar10.y;
      b.h = fVar15;
      nk_widget_text((nk_command_buffer *)CONCAT44(in_stack_ffffffffffffff84,fVar7),b,
                     (char *)CONCAT44(fVar6,fVar5),(int)len_00,(nk_text *)CONCAT44(fVar3,fVar4),
                     (nk_flags)a,
                     (nk_user_font *)
                     CONCAT44((a - out[0x12].mouse.buttons[3].clicked_pos.x) -
                              (fVar8 + fVar9 + out[0x12].mouse.prev.x +
                              out[0x12].mouse.buttons[3].clicked_pos.x),
                              fStack_4c + out[0x12].mouse.buttons[3].clicked_pos.y));
      nVar10.y = (float)nVar14;
      nVar10.x = fVar13;
      header_00.y = fVar7;
      header_00.x = fVar6;
      header_00.w = (float)in_stack_ffffffffffffff84;
      header_00.h = fVar12;
      local_4 = nk_combo_begin((nk_context *)CONCAT44(len_00,fVar11),
                               (nk_window *)CONCAT44(fVar3,fVar4),nVar10,(nk_bool)a,header_00);
    }
  }
  return local_4;
}

Assistant:

NK_API nk_bool
nk_combo_begin_symbol_text(struct nk_context *ctx, const char *selected, int len,
enum nk_symbol_type symbol, struct nk_vec2 size)
{
struct nk_window *win;
struct nk_style *style;
struct nk_input *in;

struct nk_rect header;
int is_clicked = nk_false;
enum nk_widget_layout_states s;
const struct nk_style_item *background;
struct nk_color symbol_color;
struct nk_text text;

NK_ASSERT(ctx);
NK_ASSERT(ctx->current);
NK_ASSERT(ctx->current->layout);
if (!ctx || !ctx->current || !ctx->current->layout)
return 0;

win = ctx->current;
style = &ctx->style;
s = nk_widget(&header, ctx);
if (!s) return 0;

in = (win->layout->flags & NK_WINDOW_ROM || s == NK_WIDGET_ROM)? 0: &ctx->input;
if (nk_button_behavior(&ctx->last_widget_state, header, in, NK_BUTTON_DEFAULT))
is_clicked = nk_true;

/* draw combo box header background and border */
if (ctx->last_widget_state & NK_WIDGET_STATE_ACTIVED) {
background = &style->combo.active;
symbol_color = style->combo.symbol_active;
text.text = style->combo.label_active;
} else if (ctx->last_widget_state & NK_WIDGET_STATE_HOVER) {
background = &style->combo.hover;
symbol_color = style->combo.symbol_hover;
text.text = style->combo.label_hover;
} else {
background = &style->combo.normal;
symbol_color = style->combo.symbol_normal;
text.text = style->combo.label_normal;
}
if (background->type == NK_STYLE_ITEM_IMAGE) {
text.background = nk_rgba(0,0,0,0);
nk_draw_image(&win->buffer, header, &background->data.image, nk_white);
} else {
text.background = background->data.color;
nk_fill_rect(&win->buffer, header, style->combo.rounding, background->data.color);
nk_stroke_rect(&win->buffer, header, style->combo.rounding, style->combo.border, style->combo.border_color);
}
{
struct nk_rect content;
struct nk_rect button;
struct nk_rect label;
struct nk_rect image;

enum nk_symbol_type sym;
if (ctx->last_widget_state & NK_WIDGET_STATE_HOVER)
sym = style->combo.sym_hover;
else if (is_clicked)
sym = style->combo.sym_active;
else sym = style->combo.sym_normal;

/* calculate button */
button.w = header.h - 2 * style->combo.button_padding.y;
button.x = (header.x + header.w - header.h) - style->combo.button_padding.x;
button.y = header.y + style->combo.button_padding.y;
button.h = button.w;

content.x = button.x + style->combo.button.padding.x;
content.y = button.y + style->combo.button.padding.y;
content.w = button.w - 2 * style->combo.button.padding.x;
content.h = button.h - 2 * style->combo.button.padding.y;
nk_draw_button_symbol(&win->buffer, &button, &content, ctx->last_widget_state,
&ctx->style.combo.button, sym, style->font);

/* draw symbol */
image.x = header.x + style->combo.content_padding.x;
image.y = header.y + style->combo.content_padding.y;
image.h = header.h - 2 * style->combo.content_padding.y;
image.w = image.h;
nk_draw_symbol(&win->buffer, symbol, image, text.background, symbol_color,
1.0f, style->font);

/* draw label */
text.padding = nk_vec2(0,0);
label.x = image.x + image.w + style->combo.spacing.x + style->combo.content_padding.x;
label.y = header.y + style->combo.content_padding.y;
label.w = (button.x - style->combo.content_padding.x) - label.x;
label.h = header.h - 2 * style->combo.content_padding.y;
nk_widget_text(&win->buffer, label, selected, len, &text, NK_TEXT_LEFT, style->font);
}
return nk_combo_begin(ctx, win, size, is_clicked, header);
}